

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::readFAB(FabArray<amrex::FArrayBox> *mf,int idx,string *mf_name,Header *hdr)

{
  bool bVar1;
  BaseFab<double> *this;
  ifstream *is;
  double *out;
  RealDescriptor *rd;
  Long LVar2;
  string FullName;
  string local_50;
  
  this = &FabArray<amrex::FArrayBox>::fabPtr(mf,idx)->super_BaseFab<double>;
  DirName(&local_50,mf_name);
  std::__cxx11::string::append((string *)&local_50);
  is = OpenStream(&local_50);
  std::istream::seekg((long)is,(_Ios_Seekdir)
                               (hdr->m_fod).
                               super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               .
                               super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].m_head);
  if (hdr->m_vers - 2U < 3) {
    out = BaseFab<double>::dataPtr(this,0);
    rd = FPC::NativeRealDescriptor();
    bVar1 = RealDescriptor::operator==(&hdr->m_writtenRD,rd);
    if (bVar1) {
      std::istream::read((char *)is,(long)out);
    }
    else {
      LVar2 = Box::numPts(&this->domain);
      RealDescriptor::convertToNativeFormat(out,this->nvar * LVar2,(istream *)is,&hdr->m_writtenRD);
    }
  }
  else {
    FArrayBox::readFrom((FArrayBox *)this,(istream *)is);
  }
  CloseStream(&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
VisMF::readFAB (FabArray<FArrayBox> &mf,
                int                  idx,
                const std::string&   mf_name,
                const VisMF::Header& hdr)
{
//    BL_PROFILE("VisMF::readFAB_mf");
    FArrayBox &fab = mf[idx];

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(NoFabHeader(hdr)) {
      Real* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
        infs->read((char *) fabdata, fab.nBytes());
      } else {
        Long readDataItems(fab.box().numPts() * fab.nComp());
        RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                              *infs, hdr.m_writtenRD);
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab.dataPtr(), hostfab->dataPtr(), fab.size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    } else {
      fab.readFrom(*infs);
    }

    VisMF::CloseStream(FullName);
}